

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0015(TypeCheckerTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\ntypedef struct s { double m ; } t ;\nvoid _ ( )\n{\n    t * x ;\n    x -> m ;\n}\n",
             &local_e1);
  Expectation::Expectation(&local_c0);
  checkTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCheckerTester::case0015()
{
    auto s = R"(
typedef struct s { double m ; } t ;
void _ ( )
{
    t * x ;
    x -> m ;
}
)";

    checkTypes(s, Expectation());
}